

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPlessthan(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  svalue_t right;
  svalue_t left;
  
  left.string.Chars = FString::NullString.Nothing;
  right.type = 1;
  left.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  right.string.Chars = FString::NullString.Nothing;
  right.value.i = 0;
  left.type = right.type;
  EvaluateExpression(this,&left,start,n + -1);
  EvaluateExpression(this,&right,n + 1,stop);
  result->type = 1;
  if ((left.type == 6) || (right.type == 6)) {
    iVar1 = fixedvalue(&left);
    iVar2 = fixedvalue(&right);
  }
  else {
    iVar1 = intvalue(&left);
    iVar2 = intvalue(&right);
  }
  *(uint *)&result->value = (uint)(iVar1 < iVar2);
  FString::~FString(&right.string);
  FString::~FString(&left.string);
  return;
}

Assistant:

void FParser::OPlessthan(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	result.type = svt_int;
	
	// haleyjd: 8-17
	if(left.type == svt_fixed || right.type == svt_fixed)
		result.value.i = (fixedvalue(left) < fixedvalue(right));
	else
		result.value.i = (intvalue(left) < intvalue(right));
	
}